

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProxy.cpp
# Opt level: O3

void __thiscall ImageProxy::Save(ImageProxy *this,ostream *to)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (ostream *)operator<<(to,&this->_extent);
  __s = this->_fileName;
  if (__s != (char *)0x0) {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
    return;
  }
  std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  return;
}

Assistant:

void ImageProxy::Save (ostream& to) {
    to << _extent << _fileName;
}